

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O0

void __thiscall TasGrid::GridSequence::loadGpuNodes<float>(GridSequence *this)

{
  AccelerationContext *acc;
  bool bVar1;
  int iVar2;
  unique_ptr *this_00;
  pointer pCVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  iterator iVar6;
  int *piVar7;
  iterator ibegin;
  iterator iend;
  MultiIndexSet *local_f8;
  int local_b8;
  int local_b4;
  int j;
  int i;
  Data2D<int> transpoints;
  int num_points;
  MultiIndexSet *work;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> num_nodes;
  unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
  *ccache;
  GridSequence *this_local;
  
  this_00 = (unique_ptr *)getGpuCache<float>(this);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool(this_00);
  if (!bVar1) {
    Utils::make_unique<TasGrid::CudaSequenceData<float>>();
    std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::operator=((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 *)this_00,
                (unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 *)&num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    ::std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                   *)&num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  }
  pCVar3 = std::
           unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
           ::operator->((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                         *)this_00);
  bVar1 = GpuVector<int>::empty(&pCVar3->num_nodes);
  if (bVar1) {
    pCVar3 = std::
             unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             ::operator->((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                           *)this_00);
    GpuVector<float>::load<double>
              (&pCVar3->nodes,(this->super_BaseCanonicalGrid).acceleration,
               (vector<double,_std::allocator<double>_> *)&this->nodes);
    pCVar3 = std::
             unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             ::operator->((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                           *)this_00);
    GpuVector<float>::load<double>
              (&pCVar3->coeff,(this->super_BaseCanonicalGrid).acceleration,
               (vector<double,_std::allocator<double>_> *)&this->coeff);
    iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
    ::std::allocator<int>::allocator(&local_39);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_38,(long)iVar2,&local_39);
    ::std::allocator<int>::~allocator(&local_39);
    cVar4 = ::std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)&this->max_levels);
    cVar5 = ::std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)&this->max_levels);
    iVar6 = ::std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_38);
    ::std::
    transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TasGrid::GridSequence::loadGpuNodes<float>()const::_lambda(int)_1_>
              (cVar4._M_current,cVar5._M_current,iVar6._M_current);
    pCVar3 = std::
             unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             ::operator->((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                           *)this_00);
    GpuVector<int>::load
              (&pCVar3->num_nodes,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)local_38);
    bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
    if (bVar1) {
      local_f8 = &(this->super_BaseCanonicalGrid).needed;
    }
    else {
      local_f8 = &(this->super_BaseCanonicalGrid).points;
    }
    transpoints.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(local_f8);
    iVar2 = MultiIndexSet::getNumIndexes(local_f8);
    Data2D<int>::Data2D<int,int>
              ((Data2D<int> *)&j,iVar2,(this->super_BaseCanonicalGrid).num_dimensions);
    for (local_b4 = 0;
        local_b4 <
        transpoints.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_b4 = local_b4 + 1) {
      for (local_b8 = 0; local_b8 < (this->super_BaseCanonicalGrid).num_dimensions;
          local_b8 = local_b8 + 1) {
        piVar7 = MultiIndexSet::getIndex(local_f8,local_b4);
        iVar2 = piVar7[local_b8];
        piVar7 = Data2D<int>::getStrip((Data2D<int> *)&j,local_b8);
        piVar7[local_b4] = iVar2;
      }
    }
    pCVar3 = std::
             unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             ::operator->((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                           *)this_00);
    acc = (this->super_BaseCanonicalGrid).acceleration;
    ibegin = Data2D<int>::begin((Data2D<int> *)&j);
    iend = Data2D<int>::end((Data2D<int> *)&j);
    GpuVector<int>::load<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (&pCVar3->points,acc,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)ibegin._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iend._M_current);
    Data2D<int>::~Data2D((Data2D<int> *)&j);
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38)
    ;
  }
  return;
}

Assistant:

void loadGpuNodes() const{
        auto& ccache = getGpuCache<T>();
        if (!ccache) ccache = Utils::make_unique<CudaSequenceData<T>>();
        if (!ccache->num_nodes.empty()) return;

        ccache->nodes.load(acceleration, nodes);
        ccache->coeff.load(acceleration, coeff);

        std::vector<int> num_nodes(num_dimensions);
        std::transform(max_levels.begin(), max_levels.end(), num_nodes.begin(), [](int i)->int{ return i+1; });
        ccache->num_nodes.load(acceleration, num_nodes);

        const MultiIndexSet *work = (points.empty()) ? &needed : &points;
        int num_points = work->getNumIndexes();
        Data2D<int> transpoints(work->getNumIndexes(), num_dimensions);
        for(int i=0; i<num_points; i++){
            for(int j=0; j<num_dimensions; j++){
                transpoints.getStrip(j)[i] = work->getIndex(i)[j];
            }
        }
        ccache->points.load(acceleration, transpoints.begin(), transpoints.end());
    }